

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getWSstring(DatatypeValidator *this,short theType)

{
  XMLCh *pXVar1;
  
  if (theType == 1) {
    pXVar1 = L"replace";
  }
  else {
    pXVar1 = L"preserve";
  }
  if (theType == 2) {
    pXVar1 = L"collapse";
  }
  return pXVar1;
}

Assistant:

const XMLCh* DatatypeValidator::getWSstring(const short theType) const
{
    switch (theType)
    {
    case PRESERVE:
         return SchemaSymbols::fgWS_PRESERVE;
    case REPLACE:
         return SchemaSymbols::fgWS_REPLACE;
    case COLLAPSE:
         return SchemaSymbols::fgWS_COLLAPSE;
    default:
         return SchemaSymbols::fgWS_PRESERVE;
    }

}